

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

CURLcode cpfds_add_sock(curl_pollfds *cpfds,curl_socket_t sock,short events,_Bool fold)

{
  long lVar1;
  short *psVar2;
  long lVar3;
  long lVar4;
  pollfd *ppVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  
  if (((int)CONCAT71(in_register_00000009,fold) == 0) ||
     (lVar4 = (long)(int)cpfds->n, (long)(int)cpfds->n < 0)) {
LAB_0014f03c:
    if (cpfds->count <= cpfds->n) {
      uVar6 = cpfds->count + 100;
      ppVar5 = (pollfd *)(*Curl_ccalloc)((size_t)uVar6,8);
      if (ppVar5 == (pollfd *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(ppVar5,cpfds->pfds,(ulong)cpfds->count << 3);
      if ((cpfds->field_0x10 & 1) != 0) {
        (*Curl_cfree)(cpfds->pfds);
      }
      cpfds->field_0x10 = cpfds->field_0x10 | 1;
      cpfds->pfds = ppVar5;
      cpfds->count = uVar6;
      if (ppVar5 == (pollfd *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    ppVar5 = cpfds->pfds;
    uVar6 = cpfds->n;
    ppVar5[uVar6].fd = sock;
    ppVar5[uVar6].events = events;
    cpfds->n = uVar6 + 1;
  }
  else {
    do {
      if (lVar4 < 1) goto LAB_0014f03c;
      lVar1 = lVar4 + -1;
      lVar3 = lVar4 + -1;
      lVar4 = lVar1;
    } while (cpfds->pfds[lVar3].fd != sock);
    psVar2 = &cpfds->pfds[lVar1].events;
    *psVar2 = *psVar2 | events;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cpfds_add_sock(struct curl_pollfds *cpfds,
                               curl_socket_t sock, short events, bool fold)
{
  int i;

  if(fold && cpfds->n <= INT_MAX) {
    for(i = (int)cpfds->n - 1; i >= 0; --i) {
      if(sock == cpfds->pfds[i].fd) {
        cpfds->pfds[i].events |= events;
        return CURLE_OK;
      }
    }
  }
  /* not folded, add new entry */
  if(cpfds->n >= cpfds->count) {
    if(cpfds_increase(cpfds, 100))
      return CURLE_OUT_OF_MEMORY;
  }
  cpfds->pfds[cpfds->n].fd = sock;
  cpfds->pfds[cpfds->n].events = events;
  ++cpfds->n;
  return CURLE_OK;
}